

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O3

int factorial(int32_t a)

{
  int iVar1;
  undefined8 extraout_RAX;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar15;
  uint uVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar17;
  uint uVar18;
  string local_30;
  
  if (-1 < a) {
    iVar1 = 1;
    if (1 < (uint)a) {
      uVar5 = a - 2;
      auVar13 = _DAT_00113020;
      iVar1 = 4;
      uVar7 = 1;
      uVar17 = 1;
      uVar10 = 1;
      uVar18 = 1;
      do {
        uVar11 = uVar18;
        uVar9 = uVar10;
        uVar8 = uVar17;
        uVar6 = uVar7;
        uVar7 = auVar13._0_4_ * uVar6;
        uVar10 = (uint)((auVar13._8_8_ & 0xffffffff) * (ulong)uVar9);
        uVar17 = auVar13._4_4_ * uVar8;
        uVar18 = auVar13._12_4_ * uVar11;
        auVar14._0_4_ = auVar13._0_4_ + 4;
        auVar14._4_4_ = auVar13._4_4_ + 4;
        auVar14._8_4_ = auVar13._8_4_ + 4;
        auVar14._12_4_ = auVar13._12_4_ + 4;
        iVar2 = iVar1 + -4;
        iVar4 = iVar1 + (a + 2U & 0xfffffffc);
        auVar13 = auVar14;
        iVar1 = iVar2;
      } while (iVar4 != 8);
      uVar3 = -iVar2;
      uVar12 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
      uVar15 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 1) ^ 0x80000000));
      uVar16 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 2) ^ 0x80000000));
      uVar5 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)((uVar3 | 3) ^ 0x80000000));
      iVar1 = (~uVar16 & uVar10 | uVar9 & uVar16) * (~uVar12 & uVar7 | uVar6 & uVar12) *
              (~uVar15 & uVar17 | uVar8 & uVar15) * (~uVar5 & uVar18 | uVar11 & uVar5);
    }
    return iVar1;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"factorial is not defined for negative numbers","");
  error(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int factorial(int32_t a)
{
	if (a < 0)
		error("factorial is not defined for negative numbers");
	uint32_t factorial = 1;
	if (a != 0)
	{
		for (int i = 1; i < a; ++i)
			factorial *= i;
	}
	return factorial;
}